

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O2

int emit_dqt(j_compress_ptr cinfo,int index)

{
  ushort uVar1;
  JQUANT_TBL *pJVar2;
  jpeg_error_mgr *pjVar3;
  long lVar4;
  int iVar5;
  
  pJVar2 = cinfo->quant_tbl_ptrs[index];
  if (pJVar2 == (JQUANT_TBL *)0x0) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x34;
    (pjVar3->msg_parm).i[0] = index;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar5 = 0;
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
    if (0xff < pJVar2->quantval[lVar4]) {
      iVar5 = 1;
    }
  }
  if (pJVar2->sent_table == 0) {
    emit_marker(cinfo,M_DQT);
    emit_2bytes(cinfo,(uint)(iVar5 != 0) * 0x40 + 0x43);
    emit_byte(cinfo,iVar5 * 0x10 + index);
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
      uVar1 = pJVar2->quantval[jpeg_natural_order[lVar4]];
      if (iVar5 != 0) {
        emit_byte(cinfo,(uint)(uVar1 >> 8));
      }
      emit_byte(cinfo,uVar1 & 0xff);
    }
    pJVar2->sent_table = 1;
  }
  return iVar5;
}

Assistant:

LOCAL(int)
emit_dqt(j_compress_ptr cinfo, int index)
/* Emit a DQT marker */
/* Returns the precision used (0 = 8bits, 1 = 16bits) for baseline checking */
{
  JQUANT_TBL *qtbl = cinfo->quant_tbl_ptrs[index];
  int prec;
  int i;

  if (qtbl == NULL)
    ERREXIT1(cinfo, JERR_NO_QUANT_TABLE, index);

  prec = 0;
  for (i = 0; i < DCTSIZE2; i++) {
    if (qtbl->quantval[i] > 255)
      prec = 1;
  }

  if (!qtbl->sent_table) {
    emit_marker(cinfo, M_DQT);

    emit_2bytes(cinfo, prec ? DCTSIZE2 * 2 + 1 + 2 : DCTSIZE2 + 1 + 2);

    emit_byte(cinfo, index + (prec << 4));

    for (i = 0; i < DCTSIZE2; i++) {
      /* The table entries must be emitted in zigzag order. */
      unsigned int qval = qtbl->quantval[jpeg_natural_order[i]];
      if (prec)
        emit_byte(cinfo, (int)(qval >> 8));
      emit_byte(cinfo, (int)(qval & 0xFF));
    }

    qtbl->sent_table = TRUE;
  }

  return prec;
}